

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explicit.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Circle d;
  Circle a;
  Circle f;
  Circle e;
  Circle c;
  Circle b;
  
  Circle::Circle(&a,1.23);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::endl<char,std::char_traits<char>>(poVar1);
  Circle::Circle(&b,0x7b,0);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::endl<char,std::char_traits<char>>(poVar1);
  Circle::Circle(&c,&a);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::endl<char,std::char_traits<char>>(poVar1);
  Circle::Circle(&d,1.23);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::endl<char,std::char_traits<char>>(poVar1);
  Circle::Circle(&e,0x7b,0);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::endl<char,std::char_traits<char>>(poVar1);
  Circle::Circle(&f,&d);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::endl<char,std::char_traits<char>>(poVar1);
  Circle::~Circle(&f);
  Circle::~Circle(&e);
  Circle::~Circle(&d);
  Circle::~Circle(&c);
  Circle::~Circle(&b);
  Circle::~Circle(&a);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	Circle a = 1.23;

	cout << "=======================" << endl;

	Circle b = 123;

	cout << "=======================" << endl;

	Circle c = a;

	cout << "=======================" << endl;

	Circle d = Circle(1.23);

	cout << "=======================" << endl;

	Circle e = Circle(123);

	cout << "=======================" << endl;

	Circle f = d;

	cout << "=======================" << endl;
}